

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::PromReadData(FpgaIO *this,uint32_t addr,uint8_t *data,uint nbytes)

{
  BasePort *pBVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  ostream *poVar6;
  undefined4 in_register_0000000c;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  quadlet_t read_data;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint8_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,nbytes);
  local_4c = 0;
  uVar5 = 0;
  if ((addr & 0xffffff) + nbytes < 0x1000000) {
    uVar10 = addr & 0xffffff | 0x3000000;
    local_40 = data;
    do {
      uVar9 = (uint)local_38;
      uVar8 = uVar9 - local_4c;
      if (uVar9 < local_4c || uVar8 == 0) {
        uVar5 = 1;
        break;
      }
      local_48 = (uint)CONCAT71((int7)(uVar5 >> 8),uVar9 < local_4c || uVar8 == 0);
      if (0x3f < uVar8) {
        uVar8 = 0x40;
      }
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,(ulong)uVar10);
      uVar9 = 0;
      if ((char)iVar3 == '\0') {
LAB_00106c4c:
        uVar5 = 0;
        break;
      }
      for (read_data = 7; (uVar9 < 8 && (read_data != 0)); read_data = read_data & 7) {
        Amp1394_Sleep(1e-05);
        pBVar1 = (this->super_BoardIO).port;
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&read_data);
        if ((char)iVar3 == '\0') goto LAB_00106c4c;
        uVar9 = uVar9 + 1;
      }
      if (uVar9 == 8) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "PromReadData: command failed to finish, status = ");
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_00106c44:
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_00106c4c;
      }
      bVar2 = PromGetResult(this,&local_44,PROM_M25P16);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout,"PromReadData: failed to get PROM result");
        goto LAB_00106c44;
      }
      if ((local_44 & 0x3fffffff) != 0x40) {
        poVar6 = std::operator<<((ostream *)&std::cout,"PromReadData: incorrect number of bytes = ")
        ;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        goto LAB_00106c44;
      }
      uVar4 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
      uVar7 = 0xc0;
      if (3 < uVar4) {
        uVar7 = 0x2000;
      }
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar7,local_40 + local_4c,
                         (ulong)uVar8);
      uVar10 = uVar10 + uVar8;
      local_4c = local_4c + uVar8;
      uVar5 = (ulong)local_48;
    } while ((char)iVar3 != '\0');
  }
  return SUB81(uVar5,0);
}

Assistant:

bool FpgaIO::PromReadData(uint32_t addr, uint8_t *data,
                         unsigned int nbytes)
{
    uint32_t addr24 = addr&0x00ffffff;
    if (addr24+nbytes > 0x00ffffff)
        return false;
    quadlet_t write_data = 0x03000000|addr24;  // 03h = Read Data Bytes
    uint32_t page = 0;
    while (page < nbytes) {
        const unsigned int maxReadSize = 64u;
        unsigned int bytesToRead = ((nbytes-page)<maxReadSize) ? (nbytes-page) : maxReadSize;
        if (!port->WriteQuadlet(BoardId, 0x08, write_data))
            return false;
        // Read FPGA status register; if 3 LSB are 0, command has finished.
        // The IEEE-1394 clock is 24.576 MHz, so it should take
        // about 256*8*(1/24.576) = 83.3 microseconds to read 256 bytes.
        // Experimentally, 1 iteration of the loop below is sufficient
        // most of the time, with 2 iterations required occasionally.
        quadlet_t read_data = 0x0007;
        int i;
        const int MAX_LOOP_CNT = 8;
        for (i = 0; (i < MAX_LOOP_CNT) && read_data; i++) {
            Amp1394_Sleep(0.00001);   // 10 usec
            if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return false;
            read_data = read_data&0x0007;
        }
        if (i == MAX_LOOP_CNT) {
            std::cout << "PromReadData: command failed to finish, status = "
                      << std::hex << read_data << std::dec << std::endl;
            return false;
        }
        // Now, read result. This should be the number of quadlets read.
        uint32_t nRead;
        if (!PromGetResult(nRead)) {
            std::cout << "PromReadData: failed to get PROM result" << std::endl;
            return false;
        }
        nRead *= 4;
        // should never happen, as for now firmware always reads 256 bytes
        // and saves to local registers in FPGA
        if (nRead != 256) {
            std::cout << "PromReadData: incorrect number of bytes = "
                      << nRead << std::endl;
            return false;
        }

        uint32_t fver = GetFirmwareVersion();
        nodeaddr_t address;
        if (fver >= 4) {address = 0x2000;}
        else {address = 0xc0;}
        if (!port->ReadBlock(BoardId, address, (quadlet_t *)(data+page), bytesToRead))
            return false;
        write_data += bytesToRead;
        page += bytesToRead;
    }
    return true;
}